

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

int __thiscall GF2::BFunc<8UL>::Deg(BFunc<8UL> *this)

{
  int iVar1;
  MP<8UL,_GF2::MOLex<8UL>_> poly;
  MP<8UL,_GF2::MOLex<8UL>_> local_28;
  
  local_28.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_28;
  local_28.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_28;
  local_28.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size = 0;
  BFunc<8ul>::To<GF2::MOLex<8ul>>((BFunc<8ul> *)this,&local_28);
  iVar1 = MP<8UL,_GF2::MOLex<8UL>_>::Deg(&local_28);
  std::__cxx11::_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::_M_clear
            ((_List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&local_28);
  return iVar1;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}